

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O1

filepos_t UpdateDataSize(ebml_master *Element,bool_t bWithDefault,bool_t bForceWithoutMandatory,
                        int ForProfile)

{
  filepos_t *pfVar1;
  ebml_element *peVar2;
  long lVar3;
  bool_t bVar4;
  filepos_t fVar5;
  void *pvVar6;
  ebml_element *Element_00;
  bool bVar7;
  
  if (Element == (ebml_master *)0x0) {
    __assert_fail("(const void*)(Element)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                  ,0xd6,"filepos_t UpdateDataSize(ebml_master *, bool_t, bool_t, int)");
  }
  lVar3 = (**(code **)((long)(Element->Base).Base.Base.VMT + 0xa0))();
  if (lVar3 != 0) {
    if (bForceWithoutMandatory == 0) {
      bVar4 = CheckMandatory(Element,bWithDefault,ForProfile);
      if (bVar4 == 0) {
        __assert_fail("CheckMandatory((ebml_master*)Element, bWithDefault, ForProfile)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                      ,0xde,"filepos_t UpdateDataSize(ebml_master *, bool_t, bool_t, int)");
      }
    }
    fVar5 = 6;
    if (Element->CheckSumStatus == 0) {
      fVar5 = 0;
    }
    (Element->Base).DataSize = fVar5;
    Element_00 = (ebml_element *)(Element->Base).Base.Children;
    while (Element_00 != (ebml_element *)0x0) {
      if (bWithDefault == 0) {
        lVar3 = (**(code **)((long)(Element_00->Base).Base.VMT + 0x88))(Element_00);
        if (lVar3 == 0) goto LAB_0011b847;
      }
      else {
LAB_0011b847:
        (**(code **)((long)(Element_00->Base).Base.VMT + 0x98))
                  (Element_00,bWithDefault,bForceWithoutMandatory,ForProfile);
        lVar3 = (**(code **)((long)(Element_00->Base).Base.VMT + 0xa0))(Element_00,bWithDefault);
        if (lVar3 != 0) {
          __assert_fail("!EBML_ElementNeedsDataSizeUpdate(i, bWithDefault)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                        ,0xeb,"filepos_t UpdateDataSize(ebml_master *, bool_t, bool_t, int)");
        }
        if (Element_00->DataSize == -1) {
          if (Element_00 != (ebml_element *)0x0) {
            return -1;
          }
          break;
        }
        fVar5 = EBML_ElementFullSize(Element_00,bWithDefault);
        pfVar1 = &(Element->Base).DataSize;
        *pfVar1 = *pfVar1 + fVar5;
      }
      peVar2 = (ebml_element *)(Element_00->Base).Next;
      bVar7 = Element_00 == peVar2;
      Element_00 = peVar2;
      if (bVar7) {
        __assert_fail("(nodetree*)(i) != ((nodetree*)(i))->Next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                      ,0xe6,"filepos_t UpdateDataSize(ebml_master *, bool_t, bool_t, int)");
      }
    }
  }
  pvVar6 = Node_InheritedVMT((node *)Element,0x544d4245);
  fVar5 = (**(code **)((long)pvVar6 + 0x98))(Element,bWithDefault,bForceWithoutMandatory,ForProfile)
  ;
  return fVar5;
}

Assistant:

static filepos_t UpdateDataSize(ebml_master *Element, bool_t bWithDefault, bool_t bForceWithoutMandatory, int ForProfile)
{
    if (EBML_ElementNeedsDataSizeUpdate(Element, bWithDefault))
    {
        ebml_element *i;

	    //if (!EBML_ElementIsFiniteSize((ebml_element*)Element))
	    //	return INVALID_FILEPOS_T;

	    if (!bForceWithoutMandatory) {
		    assert(CheckMandatory((ebml_master*)Element, bWithDefault, ForProfile));
        }

        if (Element->CheckSumStatus)
            Element->Base.DataSize = 6;
        else
    	    Element->Base.DataSize = 0;

        for (i=EBML_MasterChildren(Element);i;i=EBML_MasterNext(i))
        {
            if (!bWithDefault && EBML_ElementIsDefaultValue(i))
                continue;
            EBML_ElementUpdateSize(i,bWithDefault,bForceWithoutMandatory, ForProfile);
            assert(!EBML_ElementNeedsDataSizeUpdate(i, bWithDefault));
            if (i->DataSize == INVALID_FILEPOS_T)
                return INVALID_FILEPOS_T;
            Element->Base.DataSize += EBML_ElementFullSize(i,bWithDefault);
        }
#ifdef TODO
	    if (bChecksumUsed) {
		    Element->DataSize += EBML_ElementFullSize(Element->Checksum,bWithDefault);
	    }
#endif
    }

    return INHERITED(Element,ebml_element_vmt,EBML_MASTER_CLASS)->UpdateDataSize(Element, bWithDefault, bForceWithoutMandatory, ForProfile);
}